

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::SequenceConcatExpr::Element>::
emplaceRealloc<slang::ast::SequenceConcatExpr::Element>
          (SmallVectorBase<slang::ast::SequenceConcatExpr::Element> *this,pointer pos,Element *args)

{
  SourceLocation *pSVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  SourceLocation SVar6;
  uint32_t uVar7;
  _Storage<unsigned_int,_true> _Var8;
  Element *__cur_1;
  pointer pEVar9;
  pointer pEVar10;
  pointer pEVar11;
  pointer pEVar12;
  AssertionExpr *pAVar13;
  AssertionExpr *ctx;
  long lVar14;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  pAVar13 = (AssertionExpr *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (AssertionExpr *)(uVar2 * 2);
  if (pAVar13 < ctx) {
    pAVar13 = ctx;
  }
  if (0x333333333333333 - uVar2 < uVar2) {
    pAVar13 = (AssertionExpr *)0x333333333333333;
  }
  lVar14 = (long)pos - (long)this->data_;
  pEVar9 = (pointer)operator_new((long)pAVar13 * 0x28);
  *(AssertionExpr **)((long)pEVar9 + lVar14 + 0x20) = (args->sequence).ptr;
  uVar4 = *(undefined8 *)&args->delay;
  uVar5 = *(undefined8 *)
           &(args->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged;
  SVar6 = (args->delayRange).endLoc;
  pSVar1 = (SourceLocation *)((long)pEVar9 + lVar14 + 0x10);
  *pSVar1 = (args->delayRange).startLoc;
  pSVar1[1] = SVar6;
  *(undefined8 *)((long)pEVar9 + lVar14) = uVar4;
  ((undefined8 *)((long)pEVar9 + lVar14))[1] = uVar5;
  pEVar12 = this->data_;
  pEVar10 = pEVar12 + this->len;
  pEVar11 = pEVar9;
  if (pEVar10 == pos) {
    for (; pEVar12 != pos; pEVar12 = pEVar12 + 1) {
      (pEVar11->sequence).ptr = (pEVar12->sequence).ptr;
      uVar7 = (pEVar12->delay).min;
      _Var8 = (pEVar12->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload;
      uVar4 = *(undefined8 *)
               &(pEVar12->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged;
      SVar6 = (pEVar12->delayRange).endLoc;
      (pEVar11->delayRange).startLoc = (pEVar12->delayRange).startLoc;
      (pEVar11->delayRange).endLoc = SVar6;
      (pEVar11->delay).min = uVar7;
      (pEVar11->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload = _Var8;
      *(undefined8 *)
       &(pEVar11->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = uVar4;
      pEVar11 = pEVar11 + 1;
    }
  }
  else {
    for (; pEVar12 != pos; pEVar12 = pEVar12 + 1) {
      ctx = (pEVar12->sequence).ptr;
      (pEVar11->sequence).ptr = ctx;
      uVar7 = (pEVar12->delay).min;
      _Var8 = (pEVar12->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload;
      uVar4 = *(undefined8 *)
               &(pEVar12->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged;
      SVar6 = (pEVar12->delayRange).endLoc;
      (pEVar11->delayRange).startLoc = (pEVar12->delayRange).startLoc;
      (pEVar11->delayRange).endLoc = SVar6;
      (pEVar11->delay).min = uVar7;
      (pEVar11->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload = _Var8;
      *(undefined8 *)
       &(pEVar11->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = uVar4;
      pEVar11 = pEVar11 + 1;
    }
    puVar3 = (undefined8 *)(lVar14 + (long)pEVar9);
    for (; pos != pEVar10; pos = pos + 1) {
      puVar3[9] = (pos->sequence).ptr;
      uVar4 = *(undefined8 *)&pos->delay;
      uVar5 = *(undefined8 *)
               &(pos->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged;
      SVar6 = (pos->delayRange).endLoc;
      *(SourceLocation *)(puVar3 + 7) = (pos->delayRange).startLoc;
      *(SourceLocation *)(puVar3 + 8) = SVar6;
      puVar3[5] = uVar4;
      puVar3[6] = uVar5;
      puVar3 = puVar3 + 5;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pAVar13;
  this->data_ = pEVar9;
  return (pointer)((long)pEVar9 + lVar14);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}